

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

void anon_unknown.dwarf_5726e0::getInstanceArrayDimensions
               (InstanceArraySymbol *array,SmallVectorBase<slang::ConstantRange> *dimensions)

{
  Scope *pSVar1;
  InstanceArraySymbol *array_00;
  
  pSVar1 = (array->super_Symbol).parentScope;
  if ((pSVar1 != (Scope *)0x0) &&
     (array_00 = (InstanceArraySymbol *)pSVar1->thisSym,
     (array_00->super_Symbol).kind == InstanceArray)) {
    getInstanceArrayDimensions(array_00,dimensions);
  }
  slang::SmallVectorBase<slang::ConstantRange>::emplace_back<slang::ConstantRange_const&>
            (dimensions,&array->range);
  return;
}

Assistant:

void getInstanceArrayDimensions(const InstanceArraySymbol& array,
                                SmallVectorBase<ConstantRange>& dimensions) {
    auto scope = array.getParentScope();
    if (scope && scope->asSymbol().kind == SymbolKind::InstanceArray)
        getInstanceArrayDimensions(scope->asSymbol().as<InstanceArraySymbol>(), dimensions);

    dimensions.push_back(array.range);
}